

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mesh.cpp
# Opt level: O3

void __thiscall Mesh::Mesh(Mesh *this,MeshData *meshData,Texture *texture,GLfloat scale)

{
  this->rotationX = 0.0;
  this->rotationY = 0.0;
  this->rotationZ = 0.0;
  this->scale = 0.0;
  this->_meshData = meshData;
  this->_texture = texture;
  this->_scale = scale;
  return;
}

Assistant:

Mesh::Mesh(MeshData* meshData, Texture* texture, GLfloat scale) {
    _meshData = meshData;
    _texture = texture;
    _scale = scale;
}